

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_shift_collapse.cpp
# Opt level: O0

RegisterShiftKind optimization::value_shift_collapse::mir_op_to_arm_shift(Op op)

{
  logic_error *this;
  int in_EDI;
  RegisterShiftKind local_1;
  
  if (in_EDI == 0x10) {
    local_1 = Lsl;
  }
  else if (in_EDI == 0x11) {
    local_1 = Lsr;
  }
  else {
    if (in_EDI != 0x12) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Input is not a valid shift!");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_1 = Asr;
  }
  return local_1;
}

Assistant:

arm::RegisterShiftKind mir_op_to_arm_shift(Op op) {
  switch (op) {
    case Op::Shl:
      return arm::RegisterShiftKind::Lsl;
    case Op::Shr:
      return arm::RegisterShiftKind::Lsr;
    case Op::ShrA:
      return arm::RegisterShiftKind::Asr;
    default:
      throw std::logic_error("Input is not a valid shift!");
  }
}